

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdstore.cc
# Opt level: O3

int __thiscall bdStore::getPeer(bdStore *this,bdPeer *peer)

{
  long lVar1;
  _List_node_base *p_Var2;
  bdPeer *pbVar3;
  _List_node_base *p_Var4;
  
  p_Var4 = (this->store).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
           super__List_node_base._M_next;
  lVar1 = (long)this->mIndex;
  if (lVar1 < 1) {
    if (this->mIndex != 0) {
      do {
        p_Var4 = p_Var4->_M_prev;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0);
    }
  }
  else {
    do {
      p_Var4 = p_Var4->_M_next;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  if (p_Var4 == (_List_node_base *)&this->store) {
    return 0;
  }
  p_Var2 = p_Var4 + 1;
  pbVar3 = peer;
  for (lVar1 = 8; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(_List_node_base **)&(pbVar3->mPeerId).addr = p_Var2->_M_next;
    p_Var2 = (_List_node_base *)&p_Var2->_M_prev;
    pbVar3 = (bdPeer *)(pbVar3->mPeerId).addr.sin_zero;
  }
  peer->mExtraFlags = *(uint32_t *)&p_Var4[5]._M_next;
  this->mIndex = this->mIndex + 1;
  return 1;
}

Assistant:

int bdStore::getPeer(bdPeer *peer) {
#ifdef DEBUG_STORE
	fprintf(stderr, "bdStore::getPeer() %ld Peers left\n", (long) store.size());
#endif

    std::list<bdPeer>::iterator it = store.begin();
    std::advance(it, mIndex);
	if (it != store.end()) {
		*peer = *it;
		mIndex++;
		return 1;
	}
	return 0;
}